

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_getstr(Table *t,TString *key)

{
  int *piVar1;
  Node *pNVar2;
  TValue *pTVar3;
  TValue ko;
  Value local_10;
  byte local_8;
  
  if (key->tt == 4) {
    pNVar2 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
    do {
      if (((pNVar2->u).key_tt == 'D') && ((TString *)(pNVar2->u).key_val.gc == key)) {
        return (TValue *)pNVar2;
      }
      piVar1 = &(pNVar2->u).next;
      pNVar2 = pNVar2 + *piVar1;
    } while ((long)*piVar1 != 0);
    pTVar3 = &absentkey;
  }
  else {
    local_8 = key->tt | 0x40;
    local_10 = (Value)key;
    pTVar3 = getgeneric(t,(TValue *)&local_10,0);
  }
  return pTVar3;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_VSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko, 0);
  }
}